

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O0

lest * __thiscall
lest::to_string<std::__cxx11::string,char[6]>
          (lest *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
          string *op,char (*rhs) [6])

{
  ostream *poVar1;
  string local_218 [32];
  char (*local_1f8) [6];
  lest local_1f0 [48];
  lest local_1c0 [32];
  ostringstream local_1a0 [8];
  ostringstream os;
  char (*rhs_local) [6];
  string *op_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  to_string(local_1c0,lhs);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)op);
  poVar1 = std::operator<<(poVar1," ");
  local_1f8 = rhs;
  to_string_abi_cxx11_(local_1f0,(char **)&local_1f8);
  std::operator<<(poVar1,(string *)local_1f0);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)this,local_218);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return this;
}

Assistant:

inline std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}